

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  char **ppcVar1;
  cmake *pcVar2;
  pointer puVar3;
  pointer pGVar4;
  bool bVar5;
  string *psVar6;
  char *pcVar7;
  ostream *poVar8;
  GlobalTargetInfo *globalTarget;
  GlobalTargetInfo *gti;
  char **args;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *mf;
  pointer puVar9;
  __single_object dirMfu;
  cmAlphaNum local_2d8;
  cmAlphaNum local_2a8;
  string f;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  globalTargets;
  char *logs [3];
  cmStateSnapshot snapshot;
  char num [100];
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  this->NextDeferId = 0;
  pcVar2 = this->CMakeInstance;
  snapshot.Position.Position = (pcVar2->CurrentSnapshot).Position.Position;
  snapshot.State = (pcVar2->CurrentSnapshot).State;
  snapshot.Position.Tree = (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar6 = cmake::GetHomeDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&globalTargets,psVar6);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&globalTargets,&snapshot);
  psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&globalTargets,psVar6);
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)this;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&dirMfu,(cmStateSnapshot *)&globalTargets);
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&this->Makefiles,&dirMfu);
  cmMakefile::SetRecursionDepth
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,this->RecursionDepth);
  IndexMakefile(this,(cmMakefile *)
                     dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
                     ._M_t.super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                     super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,psVar6);
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmMakefile::Configure
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  cmMakefile::EnforceDirectoryLevelRules
            ((cmMakefile *)
             dirMfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
  this->ConfigureDoneCMP0026AndCMP0024 = true;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  globalTargets.
  super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CreateDefaultGlobalTargets(this,&globalTargets);
  puVar3 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (this->Makefiles).
                super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar4 = globalTargets.
               super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      gti = globalTargets.
            super__Vector_base<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
            ._M_impl.super__Vector_impl_data._M_start, puVar9 != puVar3; puVar9 = puVar9 + 1) {
    for (; gti != pGVar4; gti = gti + 1) {
      CreateGlobalTarget(this,gti,(puVar9->_M_t).
                                  super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                                  .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl);
    }
  }
  std::
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  ::~vector(&globalTargets);
  snprintf(num,100,"%d",
           (ulong)((long)(this->Makefiles).
                         super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Makefiles).
                        super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pcVar2 = this->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&globalTargets,"CMAKE_NUMBER_OF_MAKEFILES",(allocator<char> *)&local_2d8);
  cmake::AddCacheEntry(pcVar2,(string *)&globalTargets,num,"number of local generators",4);
  std::__cxx11::string::~string((string *)&globalTargets);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&globalTargets);
    bVar5 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar5) {
      std::operator<<((ostream *)&globalTargets,"Configuring incomplete, errors occurred!");
      args = logs;
      logs[2] = (char *)0x0;
      logs[0] = "CMakeOutput.log";
      logs[1] = "CMakeError.log";
      pcVar7 = "CMakeOutput.log";
      while (pcVar7 != (char *)0x0) {
        psVar6 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
        local_2d8.View_._M_str = (psVar6->_M_dataplus)._M_p;
        local_2d8.View_._M_len = psVar6->_M_string_length;
        local_2a8.View_._M_len = 0xc;
        local_2a8.View_._M_str = "/CMakeFiles/";
        cmStrCat<char_const*>(&f,&local_2d8,&local_2a8,args);
        bVar5 = cmsys::SystemTools::FileExists(&f);
        if (bVar5) {
          poVar8 = std::operator<<((ostream *)&globalTargets,"\nSee also \"");
          poVar8 = std::operator<<(poVar8,(string *)&f);
          std::operator<<(poVar8,"\".");
        }
        std::__cxx11::string::~string((string *)&f);
        ppcVar1 = args + 1;
        args = args + 1;
        pcVar7 = *ppcVar1;
      }
    }
    else {
      std::operator<<((ostream *)&globalTargets,"Configuring done");
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,(string *)&local_2d8,-1.0);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&globalTargets);
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&dirMfu);
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();
  this->NextDeferId = 0;

  cmStateSnapshot snapshot = this->CMakeInstance->GetCurrentSnapshot();

  snapshot.GetDirectory().SetCurrentSource(
    this->CMakeInstance->GetHomeDirectory());
  snapshot.GetDirectory().SetCurrentBinary(
    this->CMakeInstance->GetHomeOutputDirectory());

  auto dirMfu = cm::make_unique<cmMakefile>(this, snapshot);
  auto* dirMf = dirMfu.get();
  this->Makefiles.push_back(std::move(dirMfu));
  dirMf->SetRecursionDepth(this->RecursionDepth);
  this->IndexMakefile(dirMf);

  this->BinaryDirectories.insert(
    this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  dirMf->Configure();
  dirMf->EnforceDirectoryLevelRules();

  this->ConfigureDoneCMP0026AndCMP0024 = true;

  // Put a copy of each global target in every directory.
  {
    std::vector<GlobalTargetInfo> globalTargets;
    this->CreateDefaultGlobalTargets(globalTargets);

    for (const auto& mf : this->Makefiles) {
      for (GlobalTargetInfo const& globalTarget : globalTargets) {
        this->CreateGlobalTarget(globalTarget, mf.get());
      }
    }
  }

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  snprintf(num, sizeof(num), "%d", static_cast<int>(this->Makefiles.size()));
  this->GetCMakeInstance()->AddCacheEntry("CMAKE_NUMBER_OF_MAKEFILES", num,
                                          "number of local generators",
                                          cmStateEnums::INTERNAL);

  if (this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE) {
    std::ostringstream msg;
    if (cmSystemTools::GetErrorOccurredFlag()) {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = { "CMakeOutput.log", "CMakeError.log", nullptr };
      for (const char** log = logs; *log; ++log) {
        std::string f = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                                 "/CMakeFiles/", *log);
        if (cmSystemTools::FileExists(f)) {
          msg << "\nSee also \"" << f << "\".";
        }
      }
    } else {
      msg << "Configuring done";
    }
    this->CMakeInstance->UpdateProgress(msg.str(), -1);
  }
}